

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_autolink(MD_CTX *ctx,MD_OFFSET beg,MD_OFFSET max_end,MD_OFFSET *p_end,
                  int *p_missing_mailto)

{
  int iVar1;
  MD_OFFSET *in_RCX;
  MD_OFFSET in_EDX;
  MD_OFFSET in_ESI;
  MD_CTX *in_RDI;
  undefined4 *in_R8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = md_is_autolink_uri(in_RDI,in_ESI,in_EDX,in_RCX);
  if (iVar1 == 0) {
    iVar1 = md_is_autolink_email
                      ((MD_CTX *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (MD_OFFSET)((ulong)in_RDI >> 0x20),(MD_OFFSET)in_RDI,
                       (MD_OFFSET *)CONCAT44(in_ESI,in_EDX));
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      *in_R8 = 1;
      iVar1 = 1;
    }
  }
  else {
    *in_R8 = 0;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
md_is_autolink(MD_CTX* ctx, OFF beg, OFF max_end, OFF* p_end, int* p_missing_mailto)
{
    if(md_is_autolink_uri(ctx, beg, max_end, p_end)) {
        *p_missing_mailto = FALSE;
        return TRUE;
    }

    if(md_is_autolink_email(ctx, beg, max_end, p_end)) {
        *p_missing_mailto = TRUE;
        return TRUE;
    }

    return FALSE;
}